

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O0

jas_stream_t * jas_stream_tmpfile(void)

{
  int iVar1;
  int *piVar2;
  jas_stream_fileobj_t *obj;
  jas_stream_t *stream;
  
  iVar1 = jas_getdbglevel();
  if (99 < iVar1) {
    jas_eprintf("jas_stream_tmpfile()\n");
  }
  stream = jas_stream_create();
  if (stream == (jas_stream_t *)0x0) {
    stream = (jas_stream_t *)0x0;
  }
  else {
    stream->openmode_ = 0xb;
    piVar2 = (int *)jas_malloc(0x20);
    if (piVar2 == (int *)0x0) {
      jas_stream_destroy(stream);
      stream = (jas_stream_t *)0x0;
    }
    else {
      *piVar2 = -1;
      piVar2[1] = 0;
      *(undefined1 *)(piVar2 + 2) = 0;
      stream->obj_ = piVar2;
      tmpnam((char *)(piVar2 + 2));
      iVar1 = open((char *)(piVar2 + 2),0x2c2,0x1b6);
      *piVar2 = iVar1;
      if (iVar1 < 0) {
        jas_stream_destroy(stream);
        stream = (jas_stream_t *)0x0;
      }
      else {
        iVar1 = unlink((char *)(piVar2 + 2));
        if (iVar1 != 0) {
          piVar2[1] = piVar2[1] | 1;
        }
        jas_stream_initbuf(stream,2,(char *)0x0,0);
        stream->ops_ = &jas_stream_fileops;
      }
    }
  }
  return stream;
}

Assistant:

jas_stream_t *jas_stream_tmpfile()
{
	jas_stream_t *stream;
	jas_stream_fileobj_t *obj;

	JAS_DBGLOG(100, ("jas_stream_tmpfile()\n"));

	if (!(stream = jas_stream_create())) {
		return 0;
	}

	/* A temporary file stream is always opened for both reading and
	writing in binary mode. */
	stream->openmode_ = JAS_STREAM_READ | JAS_STREAM_WRITE | JAS_STREAM_BINARY;

	/* Allocate memory for the underlying temporary file object. */
	if (!(obj = jas_malloc(sizeof(jas_stream_fileobj_t)))) {
		jas_stream_destroy(stream);
		return 0;
	}
	obj->fd = -1;
	obj->flags = 0;
	obj->pathname[0] = '\0';
	stream->obj_ = obj;

	/* Choose a file name. */
	tmpnam(obj->pathname);

	/* Open the underlying file. */
	if ((obj->fd = open(obj->pathname, O_CREAT | O_EXCL | O_RDWR | O_TRUNC | O_BINARY,
	  JAS_STREAM_PERMS)) < 0) {
		jas_stream_destroy(stream);
		return 0;
	}

	/* Unlink the file so that it will disappear if the program
	terminates abnormally. */
	/* Under UNIX, one can unlink an open file and continue to do I/O
	on it.  Not all operating systems support this functionality, however.
	For example, under Microsoft Windows the unlink operation will fail,
	since the file is open. */
	if (unlink(obj->pathname)) {
		/* We will try unlinking the file again after it is closed. */
		obj->flags |= JAS_STREAM_FILEOBJ_DELONCLOSE;
	}

	/* Use full buffering. */
	jas_stream_initbuf(stream, JAS_STREAM_FULLBUF, 0, 0);

	stream->ops_ = &jas_stream_fileops;

	return stream;
}